

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# service.cpp
# Opt level: O0

int __thiscall cppcms::service::procs_no(service *this)

{
  cached_settings *pcVar1;
  int procs;
  int local_c;
  
  pcVar1 = cached_settings((service *)0x366d03);
  local_c = (pcVar1->service).worker_processes;
  if (local_c < 0) {
    local_c = 0;
  }
  return local_c;
}

Assistant:

int service::procs_no()
{
	int procs=cached_settings().service.worker_processes;
	if(procs < 0)
		procs = 0;
	#ifdef CPPCMS_WIN32
	if(procs > 0)
		throw cppcms_error("Prefork is not supported under Windows and Cygwin");
	#endif
	return procs;
}